

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  WatcherGeneric *this_00;
  FileWatcherImpl *pFVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  bool *pbVar8;
  DirWatcherGeneric *this_01;
  mapped_type *ppDVar9;
  byte bVar10;
  string dir;
  string link;
  string curPath;
  string parentPath;
  FileInfo fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  WatcherGeneric *local_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  FileSystem::dirRemoveSlashAtEnd(newdir);
  pcVar2 = (newdir->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + newdir->_M_string_length);
  FileSystem::fileNameFromPath(&local_78.Filepath,&local_98);
  std::__cxx11::string::operator=((string *)newdir,(string *)&local_78);
  paVar1 = &local_78.Filepath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  pcVar2 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,
             pcVar2 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_b8);
  std::operator+(&local_1a0,&local_b8,newdir);
  FileSystem::dirAddSlashAtEnd(&local_1a0);
  FileInfo::FileInfo(&local_78,&local_1a0);
  bVar4 = FileInfo::isDirectory(&local_78);
  if (((!bVar4) || (bVar4 = FileInfo::isReadable(&local_78), !bVar4)) ||
     (bVar4 = FileSystem::isRemoteFS(&local_1a0), bVar4)) {
    this_01 = (DirWatcherGeneric *)0x0;
    goto LAB_00119504;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  FileSystem::getLinkRealPath(&local_160,&local_d8,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_160);
  this_00 = this->Watch;
  if (iVar6 == 0) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_1a0._M_dataplus._M_p,
               local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    bVar4 = WatcherGeneric::pathInWatches(this_00,&local_180);
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
    }
    else {
      pFVar3 = this->Watch->WatcherImpl;
      iVar6 = (*pFVar3->_vptr_FileWatcherImpl[10])(pFVar3,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((char)iVar6 == '\0') goto LAB_0011971f;
    }
LAB_00119717:
    this_01 = (DirWatcherGeneric *)0x0;
  }
  else {
    pbVar8 = FileWatcher::followSymlinks(this_00->WatcherImpl->mFileWatcher);
    bVar4 = *pbVar8;
    pFVar3 = this->Watch->WatcherImpl;
    iVar6 = (*pFVar3->_vptr_FileWatcherImpl[10])(pFVar3,&local_160);
    bVar10 = 1;
    if ((char)iVar6 == '\0') {
      local_140 = this->Watch;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_160._M_dataplus._M_p,
                 local_160._M_dataplus._M_p + local_160._M_string_length);
      bVar5 = WatcherGeneric::pathInWatches(local_140,&local_118);
      if (!bVar5) {
        pFVar3 = this->Watch->WatcherImpl;
        iVar7 = (*pFVar3->_vptr_FileWatcherImpl[9])(pFVar3,&local_138,&local_160);
        bVar10 = (byte)iVar7 ^ 1;
      }
    }
    if (((char)iVar6 == '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2)) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((bVar10 != 0) || (std::__cxx11::string::_M_assign((string *)&local_1a0), bVar4 == false))
    goto LAB_00119717;
LAB_0011971f:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    handleAction(this,newdir,1,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    this_01 = (DirWatcherGeneric *)operator_new(0xc0);
    DirWatcherGeneric(this_01,this,this->Watch,&local_1a0,this->Recursive,false);
    addChilds(this_01,true);
    watch(this_01,false);
    ppDVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
              ::operator[](&this->Directories,newdir);
    *ppDVar9 = this_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
LAB_00119504:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.Filepath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return this_01;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::createDirectory( std::string newdir ) {
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric* dw = NULL;

	/// Check if the directory is a symbolic link
	std::string parentPath( DirSnap.DirectoryInfo.Filepath );
	FileSystem::dirAddSlashAtEnd( parentPath );
	std::string dir( parentPath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) ) {
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() ) {
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) ||
			 !Watch->WatcherImpl->linkAllowed( curPath, link ) ) {
			skip = true;
		} else {
			dir = link;
		}
	} else {
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) ) {
			skip = true;
		}
	}

	if ( !skip ) {
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );

		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[newdir] = dw;
	}

	return dw;
}